

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNB::DataLoad(OPNB *this,OPNBData *data,void *adpcmadata)

{
  uint8 *puVar1;
  int local_24;
  int i;
  void *adpcmadata_local;
  OPNBData *data_local;
  OPNB *this_local;
  
  OPNABase::DataLoad(&this->super_OPNABase,&data->opnabase);
  if (data->adpcmasize != 0) {
    puVar1 = (uint8 *)malloc((long)data->adpcmasize);
    this->adpcmabuf = puVar1;
    memcpy(this->adpcmabuf,adpcmadata,(long)data->adpcmasize);
  }
  this->adpcmasize = data->adpcmasize;
  memcpy(this->adpcma,data->adpcma,0xd8);
  this->adpcmatl = data->adpcmatl;
  this->adpcmatvol = data->adpcmatvol;
  this->adpcmakey = data->adpcmakey;
  this->adpcmastep = data->adpcmastep;
  *(undefined8 *)this->adpcmareg = *(undefined8 *)data->adpcmareg;
  *(undefined8 *)(this->adpcmareg + 8) = *(undefined8 *)(data->adpcmareg + 8);
  *(undefined8 *)(this->adpcmareg + 0x10) = *(undefined8 *)(data->adpcmareg + 0x10);
  *(undefined8 *)(this->adpcmareg + 0x18) = *(undefined8 *)(data->adpcmareg + 0x18);
  for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
    Channel4::DataLoad((Channel4 *)(this->adpcmareg + (long)local_24 * 0x2e0 + 0x24),
                       data->ch + local_24);
  }
  (this->super_OPNABase).super_OPNBase.csmch = (Channel4 *)&this->field_0x1a98;
  return;
}

Assistant:

void OPNB::DataLoad(struct OPNBData* data, void* adpcmadata) {
	OPNABase::DataLoad(&data->opnabase);  // libOPNMIDI: bugfix DataLoad (was DataSave here)
	if(data->adpcmasize) {
		adpcmabuf = (uint8*)malloc(data->adpcmasize);
		memcpy(adpcmabuf, adpcmadata, data->adpcmasize);
	}
	adpcmasize = data->adpcmasize;
	memcpy(adpcma, data->adpcma, sizeof(ADPCMA) * 6);
	adpcmatl = data->adpcmatl;
	adpcmatvol = data->adpcmatvol;
	adpcmakey = data->adpcmakey;
	adpcmastep = data->adpcmastep;
	memcpy(adpcmareg, data->adpcmareg, 32);
	for(int i = 0; i < 6; i++) {
		ch[i].DataLoad(&data->ch[i]);
	}
	csmch = &ch[2];
}